

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O2

void k051649_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  __s = *outputs;
  __s_00 = outputs[1];
  uVar8 = (ulong)samples;
  memset(__s,0,uVar8 * 4);
  memset(__s_00,0,uVar8 * 4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    iVar1 = *(int *)((long)param + lVar7 * 0x2c + 0xc);
    if ((8 < iVar1) &&
       (puVar4 = (uint *)((long)param + lVar7 * 0x2c + 8), *(char *)((long)puVar4 + 0x2a) == '\0'))
    {
      uVar2 = *(uint *)((long)param + 0xe4);
      iVar3 = *(int *)((long)param + 0xe8);
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        uVar6 = *puVar4 + (int)(long)((float)((ulong)uVar2 << 0x10) /
                                      ((float)(uint)((iVar1 + 1) * iVar3) * 0.5) + 0.5);
        *puVar4 = uVar6;
        if (*(char *)((long)puVar4 + 9) != '\0') {
          __s[uVar5] = __s[uVar5] +
                       ((int)((uint)(byte)puVar4[2] *
                             (int)*(char *)((long)puVar4 + (ulong)(uVar6 >> 0x10 & 0x1f) + 10)) >> 4
                       );
        }
      }
    }
  }
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = __s[uVar5];
    __s[uVar5] = iVar1 << 5;
    __s_00[uVar5] = iVar1 << 5;
  }
  return;
}

Assistant:

static void k051649_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k051649_state *info = (k051649_state *)param;
	k051649_sound_channel *voice=info->channel_list;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];
	UINT32 i,j;

	// zap the contents of the mixer buffer
	memset(buffer, 0, samples * sizeof(DEV_SMPL));
	memset(buffer2, 0, samples * sizeof(DEV_SMPL));

	for (j = 0; j < 5; j++)
	{
		// channel is halted for freq < 9
		if (voice[j].frequency > 8 && ! voice[j].Muted)
		{
			UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * info->rate / 2.0f) + 0.5f);

			for (i = 0; i < samples; i++)
			{
				voice[j].counter += step;
				if (voice[j].key)
				{
					UINT32 offs = (voice[j].counter >> FREQ_BITS) & 0x1f;
					// 0x80 [wave] * 0x0F [volume] -> range +-0x780 per channel, 0x2580 total
					DEV_SMPL smpl = voice[j].waveram[offs] * voice[j].volume;
					// scale to 11 bit digital output on chip
					smpl >>= 4;	// results in [-600 .. +600]
					buffer[i] += smpl;
				}
			}
		}
	}
	for (i = 0; i < samples; i++)
	{
		// scale to +-0x7800 (fallback solution to keep volume intact)
		buffer[i] = buffer[i] * 256 / 8;
		buffer2[i] = buffer[i];
	}
}